

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param_bin(ParamDict *this,FILE *fp)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  void *pvVar4;
  Mat *pMVar5;
  void *__ptr;
  uint uVar6;
  size_t __n;
  long lVar7;
  int id;
  int len;
  uint local_40;
  int local_3c;
  FILE *local_38;
  
  clear(this);
  local_40 = 0;
  fread(&local_40,4,1,(FILE *)fp);
  if (local_40 != 0xffffff17) {
    local_38 = (FILE *)fp;
    do {
      if ((int)local_40 < -0x5b03) {
        uVar6 = -local_40 - 0x5b04;
        local_3c = 0;
        local_40 = uVar6;
        fread(&local_3c,4,1,(FILE *)fp);
        iVar3 = local_3c;
        pMVar5 = &this->params[uVar6].v;
        __n = (size_t)local_3c;
        if ((((this->params[uVar6].v.dims == 1) && (this->params[uVar6].v.w == local_3c)) &&
            (this->params[uVar6].v.elemsize == 4)) &&
           (this->params[uVar6].v.allocator == (Allocator *)0x0)) {
          __ptr = pMVar5->data;
        }
        else {
          piVar1 = this->params[uVar6].v.refcount;
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              pAVar2 = this->params[uVar6].v.allocator;
              if (pAVar2 == (Allocator *)0x0) {
                if (pMVar5->data != (void *)0x0) {
                  free(*(void **)((long)pMVar5->data + -8));
                }
              }
              else {
                (**(code **)(*(long *)pAVar2 + 8))();
              }
            }
          }
          pMVar5->data = (void *)0x0;
          this->params[uVar6].v.refcount = (int *)0x0;
          this->params[uVar6].v.elemsize = 4;
          this->params[uVar6].v.allocator = (Allocator *)0x0;
          this->params[uVar6].v.dims = 1;
          this->params[uVar6].v.w = iVar3;
          this->params[uVar6].v.h = 1;
          this->params[uVar6].v.c = 1;
          this->params[uVar6].v.cstep = __n;
          if (iVar3 == 0) {
            __n = 0;
            __ptr = (void *)0x0;
          }
          else {
            pvVar4 = malloc(__n * 4 + 0x1c);
            __ptr = (void *)((long)pvVar4 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)__ptr + -8) = pvVar4;
            pMVar5->data = __ptr;
            this->params[uVar6].v.refcount = (int *)((long)__ptr + __n * 4);
            *(undefined4 *)((long)__ptr + __n * 4) = 1;
          }
        }
        fp = (FILE *)local_38;
        fread(__ptr,4,__n,local_38);
        lVar7 = (long)(int)local_40;
      }
      else {
        lVar7 = (long)(int)local_40;
        fread(&this->params[lVar7].field_1,4,1,(FILE *)fp);
      }
      this->params[lVar7].loaded = 1;
      fread(&local_40,4,1,(FILE *)fp);
    } while (local_40 != 0xffffff17);
  }
  return 0;
}

Assistant:

int ParamDict::load_param_bin(FILE* fp)
{
    clear();

//     binary 0
//     binary 100
//     binary 1
//     binary 1.250000
//     binary 3 | array_bit
//     binary 5
//     binary 0.1
//     binary 0.2
//     binary 0.4
//     binary 0.8
//     binary 1.0
//     binary -233(EOP)

    int id = 0;
    fread(&id, sizeof(int), 1, fp);

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            fread(&len, sizeof(int), 1, fp);

            params[id].v.create(len);

            float* ptr = params[id].v;
            fread(ptr, sizeof(float), len, fp);
        }
        else
        {
            fread(&params[id].f, sizeof(float), 1, fp);
        }

        params[id].loaded = 1;

        fread(&id, sizeof(int), 1, fp);
    }

    return 0;
}